

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void mi_segment_free(mi_segment_t *segment,_Bool force,mi_segments_tld_t *tld)

{
  bool bVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  long lVar4;
  undefined7 in_register_00000031;
  mi_segments_tld_t *tld_00;
  size_t sVar5;
  mi_slice_t *slice;
  
  tld_00 = (mi_segments_tld_t *)CONCAT71(in_register_00000031,force);
  if (segment->dont_free == false) {
    sVar5 = segment->slice_entries;
    if (0 < (long)sVar5) {
      slice = segment->slices;
      do {
        if ((slice->block_size == 0) && (segment->kind != MI_SEGMENT_HUGE)) {
          mi_segment_span_remove_from_queue(slice,tld_00);
        }
        slice = slice + slice->slice_count;
      } while (slice < segment->slices + sVar5);
    }
    LOCK();
    segment->thread_id = 0;
    UNLOCK();
    _mi_segment_map_freed_at(segment);
    mi_segments_track_size(segment->segment_slices * -0x10000,tld_00);
    if (segment->was_reclaimed == true) {
      tld_00->reclaim_count = tld_00->reclaim_count - 1;
      segment->was_reclaimed = false;
    }
    lVar2 = 0;
    lVar4 = 0;
    do {
      uVar3 = (segment->commit_mask).mask[lVar2];
      if (uVar3 == 0xffffffffffffffff) {
        lVar4 = lVar4 + 0x40;
      }
      else if (uVar3 != 0) {
        do {
          lVar4 = lVar4 + (ulong)((uint)uVar3 & 1);
          bVar1 = 1 < uVar3;
          uVar3 = uVar3 >> 1;
        } while (bVar1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    sVar5 = segment->segment_slices << 0x10;
    _mi_arena_free(segment,sVar5,lVar4 * (sVar5 >> 9),segment->memid);
  }
  return;
}

Assistant:

static void mi_segment_free(mi_segment_t* segment, bool force, mi_segments_tld_t* tld) {
  MI_UNUSED(force);
  mi_assert_internal(segment != NULL);
  mi_assert_internal(segment->next == NULL);
  mi_assert_internal(segment->used == 0);

  // in `mi_segment_force_abandon` we set this to true to ensure the segment's memory stays valid
  if (segment->dont_free) return;

  // Remove the free pages
  mi_slice_t* slice = &segment->slices[0];
  const mi_slice_t* end = mi_segment_slices_end(segment);
  #if MI_DEBUG>1
  size_t page_count = 0;
  #endif
  while (slice < end) {
    mi_assert_internal(slice->slice_count > 0);
    mi_assert_internal(slice->slice_offset == 0);
    mi_assert_internal(mi_slice_index(slice)==0 || slice->block_size == 0); // no more used pages ..
    if (slice->block_size == 0 && segment->kind != MI_SEGMENT_HUGE) {
      mi_segment_span_remove_from_queue(slice, tld);
    }
    #if MI_DEBUG>1
    page_count++;
    #endif
    slice = slice + slice->slice_count;
  }
  mi_assert_internal(page_count == 2); // first page is allocated by the segment itself

  // stats
  // _mi_stat_decrease(&tld->stats->page_committed, mi_segment_info_size(segment));

  // return it to the OS
  mi_segment_os_free(segment, tld);
}